

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

void __thiscall kratos::Context::add(Context *this,Generator *generator)

{
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  *this_00;
  __shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (_Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
             *)std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&generator->name);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            (local_30,(__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                      &generator->super_enable_shared_from_this<kratos::Generator>);
  std::
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  ::_M_emplace_unique<std::shared_ptr<kratos::Generator>>
            (this_00,(shared_ptr<kratos::Generator> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void Context::add(Generator *generator) {
    modules_[generator->name].emplace(generator->shared_from_this());
}